

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbus.c
# Opt level: O0

int nn_xbus_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase_vfptr *vfptr;
  nn_xbus *in_RSI;
  nn_xbus *self;
  
  vfptr = (nn_sockbase_vfptr *)nn_alloc_(0x13ca18);
  if (vfptr == (nn_sockbase_vfptr *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/bus/xbus.c"
            ,0xcc);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_xbus_init(in_RSI,vfptr,(void *)0x13ca87);
  (in_RSI->sockbase).vfptr = vfptr;
  return 0;
}

Assistant:

static int nn_xbus_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xbus *self;

    self = nn_alloc (sizeof (struct nn_xbus), "socket (bus)");
    alloc_assert (self);
    nn_xbus_init (self, &nn_xbus_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}